

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O3

ostream * docopt::operator<<(ostream *os,value *val)

{
  pointer pbVar1;
  bool bVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *el;
  pointer pbVar4;
  char *pcVar5;
  ostream *poVar6;
  char local_3c [4];
  ostream *local_38;
  
  switch(val->kind) {
  case Bool:
    value::throwIfNotKind(val,Bool);
    pcVar5 = "false";
    if ((ulong)(val->variant).boolValue != 0) {
      pcVar5 = "true";
    }
    uVar3 = (ulong)(val->variant).boolValue ^ 5;
    poVar6 = (ostream *)&std::cout;
    break;
  case Long:
    value::throwIfNotKind(val,Long);
    std::ostream::_M_insert<long>((long)&std::cout);
    return os;
  case String:
    value::throwIfNotKind(val,String);
    local_3c[2] = 0x22;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_3c + 2,1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)(val->variant).strList.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                        (val->variant).strValue._M_string_length);
    pcVar5 = local_3c + 3;
    local_3c[3] = 0x22;
    uVar3 = 1;
    break;
  case StringList:
    local_38 = os;
    value::throwIfNotKind(val,StringList);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    pbVar4 = (val->variant).strList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (pointer)(val->variant).strValue._M_string_length;
    if (pbVar4 != pbVar1) {
      bVar2 = true;
      do {
        if (!bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        }
        local_3c[0] = '\"';
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_3c,1);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
        local_3c[1] = 0x22;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_3c + 1,1);
        pbVar4 = pbVar4 + 1;
        bVar2 = false;
      } while (pbVar4 != pbVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
    return local_38;
  default:
    poVar6 = (ostream *)&std::cout;
    pcVar5 = "null";
    uVar3 = 4;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar5,uVar3);
  return os;
}

Assistant:

std::ostream& docopt::operator<<(std::ostream& os, value const& val)
{
	if (val.isBool()) {
		bool b = val.asBool();
		std::cout << (b ? "true" : "false");
	} else if (val.isLong()) {
		long v = val.asLong();
		std::cout << v;
	} else if (val.isString()) {
		std::string const& str = val.asString();
		std::cout << '"' << str << '"';
	} else if (val.isStringList()) {
		auto const& list = val.asStringList();
		std::cout << "[";
		bool first = true;
		for(auto const& el : list) {
			if (first) {
				first = false;
			} else {
				std::cout << ", ";
			}
			std::cout << '"' << el << '"';
		}
		std::cout << "]";
	} else {
		std::cout << "null";
	}
	return os;
}